

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O2

void __thiscall nn::ESoinn::deleteNodes(ESoinn *this)

{
  AbstractWeightVector *pAVar1;
  ConcreteLogger *this_00;
  pointer puVar2;
  int iVar3;
  ulong uVar4;
  pointer pEVar5;
  uint uVar6;
  undefined1 auVar7 [8];
  double dVar8;
  undefined1 auStack_68 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> deleted_neurons;
  double local_48;
  double local_40;
  uint local_34;
  
  this_00 = log_netw;
  std::__cxx11::string::string((string *)auStack_68,"deleteNodes function",(allocator *)&local_34);
  uVar6 = 0;
  logger::ConcreteLogger::debug(this_00,(string *)auStack_68,false);
  std::__cxx11::string::~string((string *)auStack_68);
  deleted_neurons.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_68 = (undefined1  [8])0x0;
  deleted_neurons.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  do {
    puVar2 = deleted_neurons.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar4 = (ulong)uVar6;
    pEVar5 = (this->m_Neurons).
             super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl
             .super__Vector_impl_data._M_start;
    auVar7 = auStack_68;
    local_34 = uVar6;
    if ((ulong)(((long)(this->m_Neurons).
                       super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar5) / 0x88) <= uVar4)
    {
      for (; auVar7 != (undefined1  [8])puVar2; auVar7 = (undefined1  [8])((long)auVar7 + 4)) {
        deleteNeuron(this,*(uint32_t *)auVar7);
      }
      pEVar5 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_start;
      for (uVar6 = 0; uVar4 = (ulong)uVar6,
          uVar4 < (ulong)(((long)(this->m_Neurons).
                                 super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar5) / 0x88);
          uVar6 = uVar6 + 1) {
        if ((pEVar5[uVar4].m_IsDeleted == false) &&
           ((int)pEVar5[uVar4].m_Neighbours._M_h._M_element_count == 0)) {
          pAVar1 = pEVar5[uVar4].super_AbstractNeuron.m_wv;
          if (pAVar1 != (AbstractWeightVector *)0x0) {
            (*pAVar1->_vptr_AbstractWeightVector[7])();
            pEVar5 = (this->m_Neurons).
                     super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          pEVar5[uVar4].m_IsDeleted = true;
        }
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68);
      return;
    }
    if (pEVar5[uVar4].m_IsDeleted == false) {
      iVar3 = (int)pEVar5[uVar4].m_Neighbours._M_h._M_element_count;
      if (iVar3 == 0) {
        pAVar1 = pEVar5[uVar4].super_AbstractNeuron.m_wv;
        if (pAVar1 != (AbstractWeightVector *)0x0) {
          (*pAVar1->_vptr_AbstractWeightVector[7])();
          uVar4 = (ulong)local_34;
          pEVar5 = (this->m_Neurons).
                   super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          iVar3 = (int)pEVar5[uVar4].m_Neighbours._M_h._M_element_count;
        }
        pEVar5[uVar4].m_IsDeleted = true;
      }
      if (iVar3 == 2) {
        local_48 = pEVar5[uVar4].m_Density;
        local_40 = this->m_C2;
        dVar8 = calcAvgDensity(this);
      }
      else {
        if (iVar3 != 1) goto LAB_0013b419;
        local_48 = pEVar5[uVar4].m_Density;
        local_40 = this->m_C1;
        dVar8 = calcAvgDensity(this);
      }
      if (local_48 < local_40 * dVar8) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_68,&local_34);
      }
    }
LAB_0013b419:
    uVar6 = local_34 + 1;
  } while( true );
}

Assistant:

void ESoinn::deleteNodes()
    {
        log_netw->debug("deleteNodes function");
        //list of neurons which we will delete
        std::vector<uint32_t> deleted_neurons;
        //double avg_density = calcAvgDensity();
        
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            if (m_Neurons[i].getNumNeighbours() == 0)
            {
                delete m_Neurons[i].getWv();   
                m_Neurons[i].setDeleted();
            }
            
            if (m_Neurons[i].getNumNeighbours() == 1)
            {
                if (m_Neurons[i].density() < m_C1 * calcAvgDensity())
                    deleted_neurons.push_back(i);
            }
            else if (m_Neurons[i].getNumNeighbours() == 2)
            {
                if (m_Neurons[i].density() < m_C2 * calcAvgDensity())
                    deleted_neurons.push_back(i);
            }            
        }
        //delete neurons from list
        for (uint32_t num: deleted_neurons)
            deleteNeuron(num);    

        //delete neurons without neighbours (it may appeared after deletion other neurons)
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            
            if (m_Neurons[i].getNumNeighbours() == 0)
            {
                delete m_Neurons[i].getWv();   
                m_Neurons[i].setDeleted();
            }
        }
    }